

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

ScanResult * __thiscall
wallet::CWallet::ScanForWalletTransactions
          (ScanResult *__return_storage_ptr__,CWallet *this,uint256 *start_block,int start_height,
          optional<int> max_height,WalletRescanReserver *reserver,bool fUpdate,bool save_progress)

{
  uint256 *puVar1;
  _Rb_tree_header *p_Var2;
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  *this_00;
  RecursiveMutex *pRVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  uchar *puVar6;
  uchar *puVar7;
  long lVar8;
  Chain *pCVar9;
  pointer pcVar10;
  WalletDatabase *pWVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  base_blob<256U> *pbVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  bool bVar20;
  int32_t iVar21;
  uint uVar22;
  int iVar23;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar24;
  FastWalletRescanFilter *this_01;
  _Rb_tree_node_base *p_Var25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  ScriptPubKeyMan *pSVar27;
  DescriptorScriptPubKeyMan *pDVar28;
  mapped_type_conflict3 *pmVar29;
  _Base_ptr p_Var30;
  Logger *pLVar31;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  char *pcVar34;
  CTransactionRef *ptx;
  ulong uVar35;
  long lVar36;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  double local_228;
  duration local_220;
  WalletBatch local_1b8;
  bool next_block;
  bool block_still_active;
  int block_height;
  double progress_current;
  uint256 prev_tip_hash;
  undefined1 auStack_178 [8];
  undefined1 local_170 [8];
  undefined1 auStack_168 [8];
  undefined1 local_160 [16];
  undefined8 local_150;
  undefined1 local_148 [19];
  undefined8 uStack_135;
  CBlockLocator loc;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  undefined1 local_c8 [16];
  uint256 next_block_hash;
  uint256 end_hash;
  uint256 tip_hash;
  uint256 block_hash;
  
  lVar8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_220.__r = std::chrono::_V2::steady_clock::now();
  }
  else {
    local_220.__r = (rep)(*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    tVar24.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    tVar24 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  if ((reserver->m_could_reserve != true) ||
     (((reserver->m_wallet->fScanningWallet)._M_base._M_i & 1U) == 0)) {
    __assert_fail("reserver.isReserved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x75a,
                  "CWallet::ScanResult wallet::CWallet::ScanForWalletTransactions(const uint256 &, int, std::optional<int>, const WalletRescanReserver &, bool, const bool)"
                 );
  }
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(start_block->super_base_blob<256U>).m_data._M_elems;
  block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 8);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x18);
  (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  puVar1 = &__return_storage_ptr__->last_failed_block;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar15 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar15->m_data)._M_elems[0x10] = '\0';
  (pbVar15->m_data)._M_elems[0x11] = '\0';
  (pbVar15->m_data)._M_elems[0x12] = '\0';
  (pbVar15->m_data)._M_elems[0x13] = '\0';
  (pbVar15->m_data)._M_elems[0x14] = '\0';
  (pbVar15->m_data)._M_elems[0x15] = '\0';
  (pbVar15->m_data)._M_elems[0x16] = '\0';
  (pbVar15->m_data)._M_elems[0x17] = '\0';
  (pbVar15->m_data)._M_elems[0x18] = '\0';
  (pbVar15->m_data)._M_elems[0x19] = '\0';
  (pbVar15->m_data)._M_elems[0x1a] = '\0';
  (pbVar15->m_data)._M_elems[0x1b] = '\0';
  (pbVar15->m_data)._M_elems[0x1c] = '\0';
  (pbVar15->m_data)._M_elems[0x1d] = '\0';
  (pbVar15->m_data)._M_elems[0x1e] = '\0';
  (pbVar15->m_data)._M_elems[0x1f] = '\0';
  __return_storage_ptr__->status = SUCCESS;
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[7] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[8] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[9] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[10] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  pbVar15 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar15->m_data)._M_elems[0xc] = '\0';
  (pbVar15->m_data)._M_elems[0xd] = '\0';
  (pbVar15->m_data)._M_elems[0xe] = '\0';
  (pbVar15->m_data)._M_elems[0xf] = '\0';
  (pbVar15->m_data)._M_elems[0x10] = '\0';
  (pbVar15->m_data)._M_elems[0x11] = '\0';
  (pbVar15->m_data)._M_elems[0x12] = '\0';
  (pbVar15->m_data)._M_elems[0x13] = '\0';
  (pbVar15->m_data)._M_elems[0x14] = '\0';
  (pbVar15->m_data)._M_elems[0x15] = '\0';
  (pbVar15->m_data)._M_elems[0x16] = '\0';
  (pbVar15->m_data)._M_elems[0x17] = '\0';
  (pbVar15->m_data)._M_elems[0x18] = '\0';
  (pbVar15->m_data)._M_elems[0x19] = '\0';
  (pbVar15->m_data)._M_elems[0x1a] = '\0';
  (pbVar15->m_data)._M_elems[0x1b] = '\0';
  pbVar15 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar15->m_data)._M_elems[0x1c] = '\0';
  (pbVar15->m_data)._M_elems[0x1d] = '\0';
  (pbVar15->m_data)._M_elems[0x1e] = '\0';
  (pbVar15->m_data)._M_elems[0x1f] = '\0';
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
    this_01 = (FastWalletRescanFilter *)0x0;
  }
  else {
    pCVar9 = this->m_chain;
    if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
    this_01 = (FastWalletRescanFilter *)0x0;
    iVar23 = (*pCVar9->_vptr_Chain[8])(pCVar9,0);
    if ((char)iVar23 != '\0') {
      this_01 = (FastWalletRescanFilter *)operator_new(0x80);
      this_01->m_wallet = this;
      p_Var2 = &(this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header;
      (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ByteVectorHash::ByteVectorHash((ByteVectorHash *)&this_01->m_filter_set);
      (this_01->m_filter_set)._M_h._M_buckets = &(this_01->m_filter_set)._M_h._M_single_bucket;
      (this_01->m_filter_set)._M_h._M_bucket_count = 1;
      (this_01->m_filter_set)._M_h._M_before_begin = (_Hash_node_base *)0x0;
      (this_01->m_filter_set)._M_h._M_element_count = 0;
      (this_01->m_filter_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined1 (*) [16])&(this_01->m_filter_set)._M_h._M_rehash_policy._M_next_resize =
           (undefined1  [16])0x0;
      if (((this_01->m_wallet->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x400000000
          ) == 0) {
        __assert_fail("!m_wallet.IsLegacy()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x13d,
                      "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                     );
      }
      GetAllScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&prev_tip_hash,this_01->m_wallet);
      p_Var5 = (_Rb_tree_node_base *)(prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 8);
      if ((_Rb_tree_node_base *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ != p_Var5
         ) {
        p_Var25 = (_Rb_tree_node_base *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
        do {
          if ((*(long *)(p_Var25 + 1) == 0) ||
             (pDVar28 = (DescriptorScriptPubKeyMan *)
                        __dynamic_cast(*(long *)(p_Var25 + 1),&ScriptPubKeyMan::typeinfo,
                                       &DescriptorScriptPubKeyMan::typeinfo,0),
             pDVar28 == (DescriptorScriptPubKeyMan *)0x0)) {
            __assert_fail("desc_spkm != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                          ,0x142,
                          "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                         );
          }
          anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys(this_01,pDVar28,0);
          iVar23 = (*(pDVar28->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0xc])(pDVar28);
          if ((char)iVar23 != '\0') {
            (*(pDVar28->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])((uint256 *)&loc,pDVar28)
            ;
            iVar21 = DescriptorScriptPubKeyMan::GetEndRange(pDVar28);
            tip_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar21;
            tip_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar21 >> 8);
            tip_hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar21 >> 0x10);
            tip_hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar21 >> 0x18);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
            ::_M_emplace_unique<uint256,int>
                      ((_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
                        *)&this_01->m_last_range_ends,(uint256 *)&loc,(int *)&tip_hash);
          }
          p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
        } while (p_Var25 != p_Var5);
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&prev_tip_hash);
    }
  }
  base_blob<256u>::ToString_abi_cxx11_((string *)&prev_tip_hash,start_block);
  pcVar34 = "fast variant using block filters";
  if (this_01 == (FastWalletRescanFilter *)0x0) {
    pcVar34 = "slow variant inspecting all blocks";
  }
  loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pcVar34;
  WalletLogPrintf<std::__cxx11::string,char_const*>
            (this,(ConstevalFormatString<2U>)0x82e63c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prev_tip_hash,
             (char **)&loc);
  puVar6 = prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar6) {
    operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  LOCK();
  (this->fAbortRescan)._M_base._M_i = false;
  UNLOCK();
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&prev_tip_hash,anon_var_dwarf_1d6b633,anon_var_dwarf_1d6b633 + 0xd);
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    auStack_178 = (undefined1  [8])(local_170 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_178,anon_var_dwarf_1d6b633,anon_var_dwarf_1d6b633 + 0xd);
  }
  else {
    end_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1d6b633;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_178,
               (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&end_hash);
  }
  pbVar26 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_178,0,0,"%s ",3);
  puVar7 = tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar26->_M_dataplus)._M_p;
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar26->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar33) {
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
    tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((long)&pbVar26->field_2 + 8);
    tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar7;
  }
  else {
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
  }
  tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar26->_M_string_length;
  (pbVar26->_M_dataplus)._M_p = (pointer)pbVar33;
  pbVar26->_M_string_length = 0;
  (pbVar26->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)&end_hash,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&tip_hash,(string *)&end_hash,pbVar33);
  this_00 = &this->ShowProgress;
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,0);
  if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if ((uchar *)end_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      end_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)end_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    end_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar7) {
    operator_delete((void *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if (auStack_178 != (undefined1  [8])(local_170 + 8)) {
    operator_delete((void *)auStack_178,(long)auStack_168 + 1);
  }
  if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar6) {
    operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pRVar3 = &this->cs_wallet;
  auVar14[0xf] = 0;
  auVar14[0] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  auVar14[1] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  auVar14[2] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  auVar14[3] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  auVar14[4] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  auVar14[5] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  auVar14[6] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  auVar14[7] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  auVar14[8] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  auVar14[9] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  auVar14[10] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  auVar14[0xb] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar14[0xc] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar14[0xd] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar14[0xe] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = auVar14 << 8;
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pRVar3;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
  if (this->m_last_block_processed_height < 0) {
LAB_00514e3c:
    __assert_fail("m_last_block_processed_height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x3d7,"uint256 wallet::CWallet::GetLastBlockHash() const");
  }
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
  tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
  tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
  tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
  end_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  end_hash.super_base_blob<256U>.m_data._M_elems[0] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0];
  end_hash.super_base_blob<256U>.m_data._M_elems[1] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[1];
  end_hash.super_base_blob<256U>.m_data._M_elems[2] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[2];
  end_hash.super_base_blob<256U>.m_data._M_elems[3] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[3];
  end_hash.super_base_blob<256U>.m_data._M_elems[4] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[4];
  end_hash.super_base_blob<256U>.m_data._M_elems[5] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[5];
  end_hash.super_base_blob<256U>.m_data._M_elems[6] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[6];
  end_hash.super_base_blob<256U>.m_data._M_elems[7] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[7];
  end_hash.super_base_blob<256U>.m_data._M_elems[8] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[8];
  end_hash.super_base_blob<256U>.m_data._M_elems[9] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  end_hash.super_base_blob<256U>.m_data._M_elems[10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    pCVar9 = this->m_chain;
    if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
    local_160 = (undefined1  [16])0x0;
    _local_170 = (undefined1  [16])0x0;
    stack0xfffffffffffffe80 = (undefined1  [16])0x0;
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_150 = 0;
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (string *)&end_hash;
    (*pCVar9->_vptr_Chain[0xc])
              (pCVar9,&tip_hash,
               max_height.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>);
  }
  pCVar9 = this->m_chain;
  if (pCVar9 == (Chain *)0x0) {
LAB_00514ea3:
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  (*pCVar9->_vptr_Chain[0x10])(pCVar9,&block_hash);
  pCVar9 = this->m_chain;
  if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
  (*pCVar9->_vptr_Chain[0x10])(pCVar9,&end_hash);
  block_height = start_height;
  if (((this->fAbortRescan)._M_base._M_i & 1U) == 0) {
    local_228 = extraout_XMM0_Qa_00;
    progress_current = extraout_XMM0_Qa;
    do {
      if (this->m_chain == (Chain *)0x0) goto LAB_00514ea3;
      iVar23 = (*this->m_chain->_vptr_Chain[0x24])();
      if ((char)iVar23 != '\0') break;
      if (0.0 < local_228 - extraout_XMM0_Qa) {
        LOCK();
        (this->m_scanning_progress).super___atomic_float<double>._M_fp =
             (progress_current - extraout_XMM0_Qa) / (local_228 - extraout_XMM0_Qa);
        UNLOCK();
        if ((block_height * -0x3d70a3d7 + 0x51eb850U >> 2 | block_height * 0x40000000) < 0x28f5c29)
        {
          prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&prev_tip_hash,anon_var_dwarf_1d6b633,anon_var_dwarf_1d6b633 + 0xd);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            auStack_178 = (undefined1  [8])(local_170 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_178,anon_var_dwarf_1d6b633,anon_var_dwarf_1d6b633 + 0xd);
          }
          else {
            criticalblock43.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1d6b633;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_178,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&criticalblock43);
          }
          pbVar26 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              auStack_178,0,0,"%s ",3);
          next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
          pcVar10 = (pbVar26->_M_dataplus)._M_p;
          pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar26->field_2;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10 ==
              pbVar33) {
            next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
            next_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)((long)&pbVar26->field_2 + 8);
          }
          else {
            next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
            next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pcVar10;
          }
          next_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar26->_M_string_length;
          (pbVar26->_M_dataplus)._M_p = (pointer)pbVar33;
          pbVar26->_M_string_length = 0;
          (pbVar26->field_2)._M_local_buf[0] = '\0';
          GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
          tinyformat::format<std::__cxx11::string>
                    ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,
                     pbVar33);
          iVar23 = (int)((this->m_scanning_progress).super___atomic_float<double>._M_fp * 100.0);
          if (0x62 < iVar23) {
            iVar23 = 99;
          }
          if (iVar23 < 2) {
            iVar23 = 1;
          }
          boost::signals2::
          signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
          ::operator()(this_00,(string *)&loc,iVar23);
          if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
            operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(((loc.vHave.
                                      super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage)->
                                    super_base_blob<256U>).m_data._M_elems + 1));
          }
          if (criticalblock43.super_unique_lock._M_device != (mutex_type *)local_c8) {
            operator_delete(criticalblock43.super_unique_lock._M_device,local_c8._0_8_ + 1);
          }
          if ((uchar *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
              next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
            operator_delete((void *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                            next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
          }
          if (auStack_178 != (undefined1  [8])(local_170 + 8)) {
            operator_delete((void *)auStack_178,(long)auStack_168 + 1);
          }
          if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
              prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
            operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                            prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
          }
        }
      }
      else {
        LOCK();
        (this->m_scanning_progress).super___atomic_float<double>._M_fp = 0.0;
        UNLOCK();
      }
      if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
        tVar32.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      }
      else {
        tVar32 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
      }
      lVar4 = local_220.__r + 60000000000;
      if (lVar4 <= (long)tVar32.__d.__r) {
        if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
          local_220.__r = std::chrono::_V2::steady_clock::now();
        }
        else {
          local_220.__r = (rep)(*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
        }
        WalletLogPrintf<int,double>
                  (this,(ConstevalFormatString<2U>)0x82e6b4,&block_height,&progress_current);
      }
      bVar20 = true;
      if (this_01 != (FastWalletRescanFilter *)0x0) {
        for (p_Var30 = (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var30 !=
            &(this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header;
            p_Var30 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var30)) {
          pSVar27 = GetScriptPubKeyMan(this_01->m_wallet,(uint256 *)(p_Var30 + 1));
          if ((pSVar27 == (ScriptPubKeyMan *)0x0) ||
             (pDVar28 = (DescriptorScriptPubKeyMan *)
                        __dynamic_cast(pSVar27,&ScriptPubKeyMan::typeinfo,
                                       &DescriptorScriptPubKeyMan::typeinfo,0),
             pDVar28 == (DescriptorScriptPubKeyMan *)0x0)) {
            __assert_fail("desc_spkm != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                          ,0x150,
                          "void wallet::(anonymous namespace)::FastWalletRescanFilter::UpdateIfNeeded()"
                         );
          }
          iVar21 = DescriptorScriptPubKeyMan::GetEndRange(pDVar28);
          if ((int)p_Var30[2]._M_color < iVar21) {
            anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                      (this_01,pDVar28,p_Var30[2]._M_color);
            (*(pDVar28->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&prev_tip_hash,pDVar28);
            pmVar29 = std::
                      map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                      ::at(&this_01->m_last_range_ends,&prev_tip_hash);
            *pmVar29 = iVar21;
          }
        }
        pCVar9 = this_01->m_wallet->m_chain;
        if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
        uVar22 = (*pCVar9->_vptr_Chain[9])(pCVar9,0,&block_hash,&this_01->m_filter_set);
        if ((uVar22 >> 8 & 1) == 0) {
          pLVar31 = LogInstance();
          bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar31,SCAN,Debug);
          if (bVar19) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&prev_tip_hash,&block_hash);
            logging_function._M_str = "ScanForWalletTransactions";
            logging_function._M_len = 0x19;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
            ;
            source_file._M_len = 0x61;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function,source_file,0x78b,SCAN,Debug,
                       (ConstevalFormatString<2U>)0x82e72f,&block_height,(string *)&prev_tip_hash);
LAB_0051450a:
            if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
                prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
              operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                              prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
            }
          }
        }
        else if ((uVar22 & 1) == 0) {
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>.
          _M_payload.super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
          bVar20 = false;
        }
        else {
          pLVar31 = LogInstance();
          bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar31,SCAN,Debug);
          if (bVar19) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&prev_tip_hash,&block_hash);
            logging_function_00._M_str = "ScanForWalletTransactions";
            logging_function_00._M_len = 0x19;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
            ;
            source_file_00._M_len = 0x61;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function_00,source_file_00,0x784,SCAN,Debug,
                       (ConstevalFormatString<2U>)0x82e6fa,&block_height,(string *)&prev_tip_hash);
            goto LAB_0051450a;
          }
        }
      }
      block_still_active = false;
      next_block = false;
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      pCVar9 = this->m_chain;
      if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
      local_150 = 0;
      stack0xfffffffffffffe80 = ZEXT816(0);
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = ZEXT816(0);
      auStack_168 = (undefined1  [8])0x0;
      local_170 = (undefined1  [8])&block_still_active;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = &next_block_hash;
      local_160._8_8_ = 0;
      local_160._0_8_ = &loc;
      (*pCVar9->_vptr_Chain[10])(pCVar9,&block_hash,&prev_tip_hash);
      if (bVar20) {
        local_148._16_3_ = 0;
        uStack_135 = 0;
        local_148._0_8_ = (pointer)0x0;
        local_148._8_3_ = 0;
        local_148._11_5_ = 0;
        local_150 = 0;
        local_160 = ZEXT816(0);
        _local_170 = ZEXT816(0);
        stack0xfffffffffffffe80 = ZEXT816(0);
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = ZEXT816(0);
        pCVar9 = this->m_chain;
        if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (*pCVar9->_vptr_Chain[10])(pCVar9,&block_hash,&loc);
        if ((int)local_150 == 0) {
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
               block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          __return_storage_ptr__->status = FAILURE;
        }
        else {
          criticalblock43.super_unique_lock._M_owns = false;
          criticalblock43.super_unique_lock._M_device = &pRVar3->super_recursive_mutex;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
          if (block_still_active != true) {
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems +
             0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems +
             0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
            *(undefined8 *)
             (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
                 block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8)
                 = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
            __return_storage_ptr__->status = FAILURE;
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock)
            ;
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)local_148);
            break;
          }
          if ((pointer)CONCAT53(local_148._11_5_,local_148._8_3_) != (pointer)local_148._0_8_) {
            lVar36 = 0;
            uVar35 = 0;
            do {
              ptx = (CTransactionRef *)
                    ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                            local_148._0_8_)->_M_ptr + lVar36);
              loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
              loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
              loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
              bVar20 = AddToWalletIfInvolvingMe(this,ptx,(SyncTxState *)&loc,fUpdate,true);
              if (bVar20) {
                MarkInputsDirty(this,ptx);
              }
              uVar35 = uVar35 + 1;
              lVar36 = lVar36 + 0x10;
            } while (uVar35 < (ulong)(CONCAT53(local_148._11_5_,local_148._8_3_) - local_148._0_8_
                                     >> 4));
          }
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>.
          _M_payload.super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
          if (save_progress && lVar4 <= (long)tVar32.__d.__r) {
            (*this->m_chain->_vptr_Chain[6])(&loc,this->m_chain,&block_hash);
            if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start !=
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              WalletLogPrintf<int>(this,(ConstevalFormatString<1U>)0x82e776,&block_height);
              pWVar11 = (this->m_database)._M_t.
                        super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                        .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
              if (pWVar11 == (WalletDatabase *)0x0) {
                __assert_fail("static_cast<bool>(m_database)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                              ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const")
                ;
              }
              (*pWVar11->_vptr_WalletDatabase[0xe])(&local_1b8,pWVar11,1);
              local_1b8.m_database = pWVar11;
              WalletBatch::WriteBestBlock(&local_1b8,&loc);
              if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
                  local_1b8.m_batch._M_t.
                  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                  .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
                (*(*(_func_int ***)
                    local_1b8.m_batch._M_t.
                    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                    .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
              }
            }
            if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_148);
      }
      if ((max_height.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload <= block_height &&
           ((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int> & 0x100000000) != 0) || (next_block != true))
      break;
      block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
      block_hash.super_base_blob<256U>.m_data._M_elems[0] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0];
      block_hash.super_base_blob<256U>.m_data._M_elems[1] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[1];
      block_hash.super_base_blob<256U>.m_data._M_elems[2] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[2];
      block_hash.super_base_blob<256U>.m_data._M_elems[3] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[3];
      block_hash.super_base_blob<256U>.m_data._M_elems[4] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[4];
      block_hash.super_base_blob<256U>.m_data._M_elems[5] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[5];
      block_hash.super_base_blob<256U>.m_data._M_elems[6] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[6];
      block_hash.super_base_blob<256U>.m_data._M_elems[7] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[7];
      block_hash.super_base_blob<256U>.m_data._M_elems[8] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[8];
      block_hash.super_base_blob<256U>.m_data._M_elems[9] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[9];
      block_hash.super_base_blob<256U>.m_data._M_elems[10] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[10];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf];
      block_height = block_height + 1;
      if (this->m_chain == (Chain *)0x0) goto LAB_00514ea3;
      (*this->m_chain->_vptr_Chain[0x10])();
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[1];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[2];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[3];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[4];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[5];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[6];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[7];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[8] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[8];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[9];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[10];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
      criticalblock43.super_unique_lock._M_owns = false;
      progress_current = extraout_XMM0_Qa_01;
      criticalblock43.super_unique_lock._M_device = &pRVar3->super_recursive_mutex;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
      if (this->m_last_block_processed_height < 0) goto LAB_00514e3c;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10)
      ;
      uVar12 = *(undefined8 *)
                ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
      uVar16 = tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
      tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar17 = tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
      tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      uVar18 = tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar16;
      tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar17;
      tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar18;
      tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar12;
      if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) {
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             (uchar)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 8);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x10);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x18);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x20);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x28);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x30);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x38);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar12;
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] = SUB81(uVar12,1);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = SUB81(uVar12,2);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = SUB81(uVar12,3);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = SUB81(uVar12,4);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = SUB81(uVar12,5);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = SUB81(uVar12,6);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = SUB81(uVar12,7);
        auVar38[0] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar38[1] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar38[2] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar38[3] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar38[4] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar38[5] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar38[6] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar38[7] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar38[8] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar38[9] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar38[10] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar38[0xb] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar38[0xc] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar38[0xd] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar38[0xe] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar38[0xf] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0] =
             (uchar)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start;
        tip_hash.super_base_blob<256U>.m_data._M_elems[1] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 8);
        tip_hash.super_base_blob<256U>.m_data._M_elems[2] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x10);
        tip_hash.super_base_blob<256U>.m_data._M_elems[3] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x18);
        tip_hash.super_base_blob<256U>.m_data._M_elems[4] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x20);
        tip_hash.super_base_blob<256U>.m_data._M_elems[5] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x28);
        tip_hash.super_base_blob<256U>.m_data._M_elems[6] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x30);
        tip_hash.super_base_blob<256U>.m_data._M_elems[7] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x38);
        tip_hash.super_base_blob<256U>.m_data._M_elems[8] =
             (uchar)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        tip_hash.super_base_blob<256U>.m_data._M_elems[9] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 8);
        tip_hash.super_base_blob<256U>.m_data._M_elems[10] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x10);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x18);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x20);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x28);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x30);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x38);
        auVar37[0] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar37[1] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar37[2] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar37[3] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar37[4] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar37[5] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar37[6] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar37[7] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar37[8] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar37[9] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar37[10] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                       tip_hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar37[0xb] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar37[0xc] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar37[0xd] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar37[0xe] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar37[0xf] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar37 = auVar37 & auVar38;
        if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff) {
          if (this->m_chain == (Chain *)0x0) goto LAB_00514ea3;
          (*this->m_chain->_vptr_Chain[0x10])();
          local_228 = extraout_XMM0_Qa_02;
        }
      }
      if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) break;
    } while( true );
  }
  puVar6 = prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) == 0) {
    WalletLogPrintf<>(this,(ConstevalFormatString<0U>)0x82e790);
    auVar13[0xf] = 0;
    auVar13[0] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9];
    auVar13[1] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10];
    auVar13[2] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
    auVar13[3] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
    auVar13[4] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
    auVar13[5] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
    auVar13[6] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    auVar13[7] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
    auVar13[8] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
    auVar13[9] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    auVar13[10] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
    auVar13[0xb] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
    auVar13[0xc] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
    auVar13[0xd] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
    auVar13[0xe] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = auVar13 << 8;
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pRVar3;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
    pCVar9 = this->m_chain;
    if (pCVar9 == (Chain *)0x0) goto LAB_00514ea3;
    (*pCVar9->_vptr_Chain[0x34])(pCVar9,&this->super_Notifications);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
  }
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&prev_tip_hash,anon_var_dwarf_1d6b633,anon_var_dwarf_1d6b633 + 0xd);
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    auStack_178 = (undefined1  [8])(local_170 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_178,anon_var_dwarf_1d6b633,anon_var_dwarf_1d6b633 + 0xd);
  }
  else {
    criticalblock43.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1d6b633;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_178,
               (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&criticalblock43);
  }
  pbVar26 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_178,0,0,"%s ",3);
  puVar7 = next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar26->_M_dataplus)._M_p;
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar26->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar33) {
    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
    next_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((long)&pbVar26->field_2 + 8);
    next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar7;
  }
  else {
    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar33;
  }
  next_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar26->_M_string_length;
  (pbVar26->_M_dataplus)._M_p = (pointer)pbVar33;
  pbVar26->_M_string_length = 0;
  (pbVar26->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,pbVar33);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,100
              );
  if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if (criticalblock43.super_unique_lock._M_device != (mutex_type *)local_c8) {
    operator_delete(criticalblock43.super_unique_lock._M_device,local_c8._0_8_ + 1);
  }
  if ((uchar *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar7) {
    operator_delete((void *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if (auStack_178 != (undefined1  [8])(local_170 + 8)) {
    operator_delete((void *)auStack_178,(long)auStack_168 + 1);
  }
  if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar6) {
    operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if (block_height != 0) {
    if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) {
      pcVar34 = "Rescan aborted at block %d. Progress=%f\n";
      WalletLogPrintf<int,double>
                (this,(ConstevalFormatString<2U>)0x82e7b8,&block_height,&progress_current);
LAB_00514ce3:
      __return_storage_ptr__->status = USER_ABORT;
      goto LAB_00514d46;
    }
    if (block_height != 0) {
      if (this->m_chain == (Chain *)0x0) goto LAB_00514ea3;
      iVar23 = (*this->m_chain->_vptr_Chain[0x24])();
      if ((char)iVar23 != '\0') {
        pcVar34 = "Rescan interrupted by shutdown request at block %d. Progress=%f\n";
        WalletLogPrintf<int,double>
                  (this,(ConstevalFormatString<2U>)0x82e7e1,&block_height,&progress_current);
        goto LAB_00514ce3;
      }
    }
  }
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    tVar32.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    tVar32 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ((long)tVar32.__d.__r - (long)tVar24.__d.__r) / 1000000;
  pcVar34 = "Rescan completed in %15dms\n";
  WalletLogPrintf<long>(this,(ConstevalFormatString<1U>)0x82e822,(long *)&prev_tip_hash);
LAB_00514d46:
  if (this_01 != (FastWalletRescanFilter *)0x0) {
    std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>::operator()
              ((default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter> *)this_01,
               (FastWalletRescanFilter *)pcVar34);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar8) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CWallet::ScanResult CWallet::ScanForWalletTransactions(const uint256& start_block, int start_height, std::optional<int> max_height, const WalletRescanReserver& reserver, bool fUpdate, const bool save_progress)
{
    constexpr auto INTERVAL_TIME{60s};
    auto current_time{reserver.now()};
    auto start_time{reserver.now()};

    assert(reserver.isReserved());

    uint256 block_hash = start_block;
    ScanResult result;

    std::unique_ptr<FastWalletRescanFilter> fast_rescan_filter;
    if (!IsLegacy() && chain().hasBlockFilterIndex(BlockFilterType::BASIC)) fast_rescan_filter = std::make_unique<FastWalletRescanFilter>(*this);

    WalletLogPrintf("Rescan started from block %s... (%s)\n", start_block.ToString(),
                    fast_rescan_filter ? "fast variant using block filters" : "slow variant inspecting all blocks");

    fAbortRescan = false;
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 0); // show rescan progress in GUI as dialog or on splashscreen, if rescan required on startup (e.g. due to corruption)
    uint256 tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
    uint256 end_hash = tip_hash;
    if (max_height) chain().findAncestorByHeight(tip_hash, *max_height, FoundBlock().hash(end_hash));
    double progress_begin = chain().guessVerificationProgress(block_hash);
    double progress_end = chain().guessVerificationProgress(end_hash);
    double progress_current = progress_begin;
    int block_height = start_height;
    while (!fAbortRescan && !chain().shutdownRequested()) {
        if (progress_end - progress_begin > 0.0) {
            m_scanning_progress = (progress_current - progress_begin) / (progress_end - progress_begin);
        } else { // avoid divide-by-zero for single block scan range (i.e. start and stop hashes are equal)
            m_scanning_progress = 0;
        }
        if (block_height % 100 == 0 && progress_end - progress_begin > 0.0) {
            ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), std::max(1, std::min(99, (int)(m_scanning_progress * 100))));
        }

        bool next_interval = reserver.now() >= current_time + INTERVAL_TIME;
        if (next_interval) {
            current_time = reserver.now();
            WalletLogPrintf("Still rescanning. At block %d. Progress=%f\n", block_height, progress_current);
        }

        bool fetch_block{true};
        if (fast_rescan_filter) {
            fast_rescan_filter->UpdateIfNeeded();
            auto matches_block{fast_rescan_filter->MatchesBlock(block_hash)};
            if (matches_block.has_value()) {
                if (*matches_block) {
                    LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (filter matched)\n", block_height, block_hash.ToString());
                } else {
                    result.last_scanned_block = block_hash;
                    result.last_scanned_height = block_height;
                    fetch_block = false;
                }
            } else {
                LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n", block_height, block_hash.ToString());
            }
        }

        // Find next block separately from reading data above, because reading
        // is slow and there might be a reorg while it is read.
        bool block_still_active = false;
        bool next_block = false;
        uint256 next_block_hash;
        chain().findBlock(block_hash, FoundBlock().inActiveChain(block_still_active).nextBlock(FoundBlock().inActiveChain(next_block).hash(next_block_hash)));

        if (fetch_block) {
            // Read block data
            CBlock block;
            chain().findBlock(block_hash, FoundBlock().data(block));

            if (!block.IsNull()) {
                LOCK(cs_wallet);
                if (!block_still_active) {
                    // Abort scan if current block is no longer active, to prevent
                    // marking transactions as coming from the wrong block.
                    result.last_failed_block = block_hash;
                    result.status = ScanResult::FAILURE;
                    break;
                }
                for (size_t posInBlock = 0; posInBlock < block.vtx.size(); ++posInBlock) {
                    SyncTransaction(block.vtx[posInBlock], TxStateConfirmed{block_hash, block_height, static_cast<int>(posInBlock)}, fUpdate, /*rescanning_old_block=*/true);
                }
                // scan succeeded, record block as most recent successfully scanned
                result.last_scanned_block = block_hash;
                result.last_scanned_height = block_height;

                if (save_progress && next_interval) {
                    CBlockLocator loc = m_chain->getActiveChainLocator(block_hash);

                    if (!loc.IsNull()) {
                        WalletLogPrintf("Saving scan progress %d.\n", block_height);
                        WalletBatch batch(GetDatabase());
                        batch.WriteBestBlock(loc);
                    }
                }
            } else {
                // could not scan block, keep scanning but record this block as the most recent failure
                result.last_failed_block = block_hash;
                result.status = ScanResult::FAILURE;
            }
        }
        if (max_height && block_height >= *max_height) {
            break;
        }
        {
            if (!next_block) {
                // break successfully when rescan has reached the tip, or
                // previous block is no longer on the chain due to a reorg
                break;
            }

            // increment block and verification progress
            block_hash = next_block_hash;
            ++block_height;
            progress_current = chain().guessVerificationProgress(block_hash);

            // handle updated tip hash
            const uint256 prev_tip_hash = tip_hash;
            tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
            if (!max_height && prev_tip_hash != tip_hash) {
                // in case the tip has changed, update progress max
                progress_end = chain().guessVerificationProgress(tip_hash);
            }
        }
    }
    if (!max_height) {
        WalletLogPrintf("Scanning current mempool transactions.\n");
        WITH_LOCK(cs_wallet, chain().requestMempoolTransactions(*this));
    }
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 100); // hide progress dialog in GUI
    if (block_height && fAbortRescan) {
        WalletLogPrintf("Rescan aborted at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else if (block_height && chain().shutdownRequested()) {
        WalletLogPrintf("Rescan interrupted by shutdown request at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else {
        WalletLogPrintf("Rescan completed in %15dms\n", Ticks<std::chrono::milliseconds>(reserver.now() - start_time));
    }
    return result;
}